

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

Var Js::JavascriptExceptionOperators::StackTraceAccessor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  undefined1 uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  HRESULT HVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  Var pvVar11;
  RecyclableObject *obj;
  CompoundString *s;
  Type *this;
  FunctionBody *pFVar12;
  ScriptContext *pSVar13;
  LPCWSTR fileName;
  LPCWSTR pWVar14;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  void *__frameAddr;
  int index;
  int in_stack_00000010;
  undefined1 local_d0 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  Var cache;
  CallInfo callInfo_local;
  ArgumentReader args;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_80;
  StackTrace *stackTrace;
  LPCWSTR functionName;
  ULONG local_68;
  LONG local_64;
  ULONG lineNumber;
  LONG characterPosition;
  AutoNestedHandledExceptionType local_54;
  Data DStack_50;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  CompoundString *local_40;
  
  cache = (Var)callInfo;
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60e,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00aa4a58;
    *puVar10 = 0;
  }
  callInfo_local = (CallInfo)cache;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&cache);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60f,"(args.Info.Count > 0)","Should always have implicit \'this\'");
    if (!bVar4) goto LAB_00aa4a58;
    *puVar10 = 0;
  }
  pSVar13 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  if (pSVar13 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x613,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00aa4a58;
    *puVar10 = 0;
  }
  pvVar11 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar4 = VarIs<Js::RecyclableObject>(pvVar11);
  if (bVar4) {
    pvVar11 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    obj = VarTo<Js::RecyclableObject>(pvVar11);
    if (((ulong)callInfo_local & 0xfffffe) == 0) {
      __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
      __leaveScriptObject._36_4_ = 0;
      iVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x14])
                        (obj,obj,6,&__leaveScriptObject.__exceptionCheck,0,pSVar13);
      DStack_50.handledExceptionType = __leaveScriptObject.__exceptionCheck.handledExceptionType;
      __autoNestedHandledExceptionType.savedData.handledExceptionType =
           (Data)(Data)__leaveScriptObject._36_4_;
      if (iVar6 == 0 || __leaveScriptObject._32_8_ == 0) {
        _DStack_50 = (CompoundString *)
                     JavascriptLibrary::GetEmptyString
                               ((pSVar13->super_ScriptContextBase).javascriptLibrary);
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (&local_54,
                   ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                   ExceptionType_OutOfMemory);
        local_80 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)0x0;
        iVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x14])(obj,obj,5,&local_80,0,pSVar13);
        local_40 = _DStack_50;
        bVar4 = local_80 ==
                (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0;
        if (bVar4 || iVar6 == 0) {
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x19])(obj,6,_DStack_50,0,0);
        }
        else {
          bVar5 = IsErrorInstance(obj);
          s = _DStack_50;
          if (bVar5) {
            s = (CompoundString *)JavascriptConversion::ToString(obj,pSVar13);
          }
          local_40 = CompoundString::NewWithCharCapacity
                               (0x28,(pSVar13->super_ScriptContextBase).javascriptLibrary);
          CompoundString::AppendChars(local_40,(JavascriptString *)s);
          this_00 = local_80;
          if (0 < (local_80->
                  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                  ).count) {
            functionName = (LPCWSTR)pSVar13;
            _lineNumber = s;
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            index = 0;
            do {
              this = JsUtil::
                     List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ::Item(this_00,index);
              bVar5 = JavascriptExceptionContext::StackFrame::IsScriptFunction(this);
              if (bVar5) {
                pFVar12 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this);
                pSVar13 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar12);
                if (pSVar13 == (ScriptContext *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                                     ,0x64e,"(funcScriptContext)","funcScriptContext");
                  if (!bVar5) goto LAB_00aa4a58;
                  *puVar10 = 0;
                }
                if (((ScriptContext *)functionName == pSVar13) ||
                   (iVar7 = (**(code **)(**(long **)(functionName + 0x97c) + 0x40))
                                      (*(long **)(functionName + 0x97c),pSVar13), -1 < iVar7))
                goto LAB_00aa46db;
              }
              else {
LAB_00aa46db:
                pFVar12 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this);
                if ((pFVar12 == (FunctionBody *)0x0) ||
                   ((((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                     ptr)->field_0xa8 & 4) != 0)) {
                  pWVar14 = JavascriptExceptionContext::StackFrame::GetFunctionName(this);
                  AppendLibraryFrameToStackTrace(local_40,pWVar14);
                }
                else {
                  local_68 = 0;
                  local_64 = 0;
                  FunctionBody::GetLineCharOffset
                            (pFVar12,(this->field_1).byteCodeOffset,&local_68,&local_64,true);
                  fileName = ParseableFunctionInfo::GetSourceName
                                       (&pFVar12->super_ParseableFunctionInfo);
                  pWVar14 = functionName;
                  stackTrace = (StackTrace *)0x0;
                  if (DAT_015d3475 == '\x01') {
                    LeaveScriptObject<true,_false,_false>::LeaveScriptObject
                              ((LeaveScriptObject<true,_false,_false> *)local_d0,
                               (ScriptContext *)functionName,&stack0xfffffffffffffff8);
                    lVar2 = *(long *)(pWVar14 + 0x1dc);
                    uVar1 = *(undefined1 *)(lVar2 + 0x109);
                    *(undefined1 *)(lVar2 + 0x109) = 1;
                    HVar8 = JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
                                      (this,(LPCWSTR *)&stackTrace);
                    if (HVar8 != 0) {
                      stackTrace = (StackTrace *)
                                   ParseableFunctionInfo::GetExternalDisplayName
                                             (&pFVar12->super_ParseableFunctionInfo);
                    }
                    ThreadContext::DisposeOnLeaveScript(*(ThreadContext **)(functionName + 0x1dc));
                    *(undefined1 *)(lVar2 + 0x109) = uVar1;
                    LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
                              ((LeaveScriptObject<true,_false,_false> *)local_d0);
                  }
                  else {
                    stackTrace = (StackTrace *)
                                 ParseableFunctionInfo::GetExternalDisplayName
                                           (&pFVar12->super_ParseableFunctionInfo);
                  }
                  if (fileName == (LPCWSTR)0x0) {
                    fileName = L"";
                  }
                  AppendExternalFrameToStackTrace
                            (local_40,(LPCWSTR)stackTrace,fileName,local_68 + 1,local_64 + 1);
                }
              }
              index = index + 1;
              this_00 = local_80;
            } while (index < (local_80->
                             super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                             ).count);
          }
        }
        if (bVar4 || iVar6 == 0) {
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_54);
          __leaveScriptObject._32_8_ = _DStack_50;
        }
        else {
          BVar9 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
          if (BVar9 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                               ,0x67c,
                               "(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                               "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
            if (!bVar4) {
LAB_00aa4a58:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar10 = 0;
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_54);
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x19])(obj,6,local_40,0,0);
          __leaveScriptObject._32_8_ = local_40;
        }
      }
    }
    else {
      pvVar11 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x19])(obj,6,pvVar11,0,0);
      bVar4 = VarIs<Js::JavascriptError,Js::RecyclableObject>(obj);
      if (bVar4) {
        *(undefined1 *)((long)&obj[2].type.ptr + 4) = 1;
      }
      __leaveScriptObject._32_8_ =
           JavascriptLibrary::GetEmptyString((pSVar13->super_ScriptContextBase).javascriptLibrary);
    }
  }
  else {
    __leaveScriptObject._32_8_ =
         (((pSVar13->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
  }
  return (Var)__leaveScriptObject._32_8_;
}

Assistant:

Var JavascriptExceptionOperators::StackTraceAccessor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext *scriptContext = function->GetScriptContext();

        AnalysisAssert(scriptContext);

        // If the first argument to the accessor is not a recyclable object, return undefined
        // for compat with other browsers
        if (!VarIs<RecyclableObject>(args[0]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject *obj = VarTo<RecyclableObject>(args[0]);

        // If an argument was passed to the accessor, it is being called as a setter.
        // Set the internal StackTraceCache property accordingly.
        if (args.Info.Count > 1)
        {
            obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, args[1], PropertyOperationFlags::PropertyOperation_None, NULL);
            if (VarIs<JavascriptError>(obj))
            {
                ((JavascriptError *)obj)->SetStackPropertyRedefined(true);
            }
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Otherwise, the accessor is being called as a getter.
        // Return existing cached value, or obtain the string representation of the StackTrace to return.
        Var cache = NULL;
        if (obj->GetInternalProperty(obj,InternalPropertyIds::StackTraceCache, (Var*)&cache, NULL, scriptContext) && cache)
        {
            return cache;
        }

        JavascriptString* stringMessage = scriptContext->GetLibrary()->GetEmptyString();
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            Js::JavascriptExceptionContext::StackTrace *stackTrace = NULL;
            if (!obj->GetInternalProperty(obj,InternalPropertyIds::StackTrace, (Js::Var*) &stackTrace, NULL, scriptContext) ||
                stackTrace == nullptr)
            {
                obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, stringMessage, PropertyOperationFlags::PropertyOperation_None, NULL);
                return stringMessage;
            }

            if (IsErrorInstance(obj))
            {
                stringMessage = JavascriptConversion::ToString(obj, scriptContext);
            }

            CompoundString *const stringBuilder = CompoundString::NewWithCharCapacity(40, scriptContext->GetLibrary());
            stringBuilder->AppendChars(stringMessage);

            for (int i = 0; i < stackTrace->Count(); i++)
            {
                Js::JavascriptExceptionContext::StackFrame& currentFrame = stackTrace->Item(i);

                // Defend in depth. Discard cross domain frames if somehow they creped in.
                if (currentFrame.IsScriptFunction())
                {
                    ScriptContext* funcScriptContext = currentFrame.GetFunctionBody()->GetScriptContext();
                    AnalysisAssert(funcScriptContext);
                    if (scriptContext != funcScriptContext && FAILED(scriptContext->GetHostScriptContext()->CheckCrossDomainScriptContext(funcScriptContext)))
                    {
                        continue; // Ignore this frame
                    }
                }

                FunctionBody* functionBody = currentFrame.GetFunctionBody();
                const bool isLibraryCode = !functionBody || functionBody->GetUtf8SourceInfo()->GetIsLibraryCode();
                if (isLibraryCode)
                {
                    AppendLibraryFrameToStackTrace(stringBuilder, currentFrame.GetFunctionName());
                }
                else
                {
                    LPCWSTR pUrl = NULL;
                    ULONG lineNumber = 0;
                    LONG characterPosition = 0;

                    functionBody->GetLineCharOffset(currentFrame.GetByteCodeOffset(), &lineNumber, &characterPosition);
                    pUrl = functionBody->GetSourceName();
                    LPCWSTR functionName = nullptr;
                    if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
                    {
                        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext)
                        {
                            if (currentFrame.GetFunctionNameWithArguments(&functionName) != S_OK)
                            {
                                functionName = functionBody->GetExternalDisplayName();
                            }
                        }
                        END_LEAVE_SCRIPT_INTERNAL(scriptContext)
                    }
                    else
                    {
                        functionName = functionBody->GetExternalDisplayName();
                    }
                    AppendExternalFrameToStackTrace(stringBuilder, functionName, pUrl ? pUrl : _u(""), lineNumber + 1, characterPosition + 1);
                }
            }

            // Try to create the string object even if we did OOM, but if can't, just return what we've got. We catch and ignore OOM so it doesn't propagate up.
            // With all the stack trace functionality, we do best effort to produce the stack trace in the case of OOM, but don't want it to trigger an OOM. Idea is if do take
            // an OOM, have some chance of producing a stack trace to see where it happened.
            stringMessage = stringBuilder;
        }